

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoader.h
# Opt level: O3

void __thiscall
frontend::loaders::SaveLoader<fp_remover::classes::Wrestler>::~SaveLoader
          (SaveLoader<fp_remover::classes::Wrestler> *this)

{
  pointer pcVar1;
  char cVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_SaveLoader = (_func_int **)&PTR___cxa_pure_virtual_00109d90;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::fstream::close();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  _M_erase_at_end(&this->contents,
                  (this->contents).
                  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  if (this->f != (fstream *)0x0) {
    (**(code **)(*(long *)this->f + 8))();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector(&this->contents);
  pcVar1 = (this->filename)._M_dataplus._M_p;
  paVar3 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~SaveLoader()
	{
		if(f->is_open()) f->close();
		contents.clear();
		delete f;
	}